

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::
ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
          (DrawIndirectBase *this,int x,int y,int width,int height,void *data)

{
  long lVar1;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uData;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&uData,(long)(width * height * 4),&local_49);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,x,y,width,height,0x1908
             ,0x1401,uData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start);
  for (lVar1 = 0;
      (long)uData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)uData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != lVar1; lVar1 = lVar1 + 1) {
    *(float *)((long)data + lVar1 * 4) =
         (float)uData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar1] / 255.0;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&uData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void DrawIndirectBase::ReadPixelsFloat<test_api::ES3>(int x, int y, int width, int height, void* data)
{
	GLfloat*			 fData = reinterpret_cast<GLfloat*>(data);
	std::vector<GLubyte> uData(width * height * 4);
	glReadPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, &uData[0]);
	for (size_t i = 0; i < uData.size(); i++)
	{
		fData[i] = float(uData[i]) / 255.0f;
	}
}